

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kparser.cc
# Opt level: O0

bool ParserBuilder::IsActionForbidden_Discriminative
               (string *a,char prev_a,uint bsize,uint ssize,uint nopen_parens,uint unary)

{
  char cVar1;
  code *pcVar2;
  bool bVar3;
  char *pcVar4;
  int in_ECX;
  int in_EDX;
  char in_SIL;
  ulong in_RDI;
  int in_R8D;
  uint in_R9D;
  bool bVar5;
  bool bVar6;
  bool is_term;
  bool is_nt;
  bool is_reduce;
  bool is_shift;
  bool local_1;
  
  pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
  bVar5 = false;
  if (*pcVar4 == 'S') {
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
    bVar5 = *pcVar4 == 'H';
  }
  pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
  bVar6 = false;
  if (*pcVar4 == 'R') {
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
    bVar6 = *pcVar4 == 'E';
  }
  pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
  cVar1 = *pcVar4;
  pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
  bVar3 = true;
  if (((!bVar5) && (bVar3 = true, !bVar6)) && (bVar3 = true, cVar1 != 'P')) {
    bVar3 = *pcVar4 == 'T';
  }
  if (!bVar3) {
    __assert_fail("is_shift || is_reduce || is_nt || is_term",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/impl/Kparser.cc"
                  ,0xb6,
                  "static bool ParserBuilder::IsActionForbidden_Discriminative(const string &, char, unsigned int, unsigned int, unsigned int, unsigned int)"
                 );
  }
  if (*pcVar4 == 'T') {
    if (((in_ECX == 2) && (in_EDX == 1)) && (in_SIL == 'R')) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else if (in_ECX == 1) {
    if (bVar5) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else if (bVar5) {
    if (in_EDX == 1) {
      local_1 = true;
    }
    else if (in_R8D == 0) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else if (cVar1 != 'P') {
    if (!bVar6) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    if (in_R9D < 4) {
      if (in_R8D == 0) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = true;
    }
  }
  else if ((in_EDX == 1) && (2 < in_R9D)) {
    local_1 = true;
  }
  else if (in_SIL == 'P') {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool IsActionForbidden_Discriminative(const string& a, char prev_a, unsigned bsize, unsigned ssize, unsigned nopen_parens, unsigned unary) {
  bool is_shift = (a[0] == 'S' && a[1]=='H');
  bool is_reduce = (a[0] == 'R' && a[1]=='E');
  bool is_nt = (a[0] == 'P');
  bool is_term = (a[0] == 'T');
  assert(is_shift || is_reduce || is_nt || is_term) ;
  static const unsigned MAX_OPEN_NTS = 100;
  static const unsigned MAX_UNARY = 3;
//  if (is_nt && nopen_parens > MAX_OPEN_NTS) return true;
  if (is_term){
    if(ssize == 2 && bsize == 1 && prev_a == 'R') return false;
    return true;
  }

  if(ssize == 1){
     if(!is_shift) return true;
     return false;
  }

  if (is_shift){
    if(bsize == 1) return true;
    if(nopen_parens == 0) return true;
    return false;
  }

  if (is_nt) {
    if(bsize == 1 && unary >= MAX_UNARY) return true;
    if(prev_a == 'P') return true;
    return false; 
  }

  if (is_reduce){
    if(unary > MAX_UNARY) return true;
    if(nopen_parens == 0) return true;
    return false;
  }

  // TODO should we control the depth of the parse in some way? i.e., as long as there
  // are items in the buffer, we can do an NT operation, which could cause trouble
}